

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall TestValueTestcompareUInt::runTestCase(TestValueTestcompareUInt *this)

{
  TestResult *pTVar1;
  Value VStack_98;
  Value local_70;
  PredicateContext local_48;
  
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_48.id_ = pTVar1->predicateId_;
  local_48.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_48.line_ = 0x52b;
  local_48.expr_ = "checkIsLess(0u, 10u)";
  local_48.next_ = (PredicateContext *)0x0;
  local_48.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_48;
  pTVar1->predicateId_ = local_48.id_ + 1;
  pTVar1->predicateStackTail_ = &local_48;
  Json::Value::Value(&local_70,0);
  Json::Value::Value(&VStack_98,10);
  ValueTest::checkIsLess(&this->super_ValueTest,&local_70,&VStack_98);
  Json::Value::~Value(&VStack_98);
  Json::Value::~Value(&local_70);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_48.id_ = pTVar1->predicateId_;
  local_48.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_48.line_ = 0x52c;
  local_48.expr_ = "checkIsLess(0u, Json::Value::maxUInt)";
  local_48.next_ = (PredicateContext *)0x0;
  local_48.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_48;
  pTVar1->predicateId_ = local_48.id_ + 1;
  pTVar1->predicateStackTail_ = &local_48;
  Json::Value::Value(&local_70,0);
  Json::Value::Value(&VStack_98,0xffffffff);
  ValueTest::checkIsLess(&this->super_ValueTest,&local_70,&VStack_98);
  Json::Value::~Value(&VStack_98);
  Json::Value::~Value(&local_70);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_48.id_ = pTVar1->predicateId_;
  local_48.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_48.line_ = 0x52d;
  local_48.expr_ = "checkIsEqual(10u, 10u)";
  local_48.next_ = (PredicateContext *)0x0;
  local_48.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_48;
  pTVar1->predicateId_ = local_48.id_ + 1;
  pTVar1->predicateStackTail_ = &local_48;
  Json::Value::Value(&local_70,10);
  Json::Value::Value(&VStack_98,10);
  ValueTest::checkIsEqual(&this->super_ValueTest,&local_70,&VStack_98);
  Json::Value::~Value(&VStack_98);
  Json::Value::~Value(&local_70);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, compareUInt) {
  JSONTEST_ASSERT_PRED(checkIsLess(0u, 10u));
  JSONTEST_ASSERT_PRED(checkIsLess(0u, Json::Value::maxUInt));
  JSONTEST_ASSERT_PRED(checkIsEqual(10u, 10u));
}